

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_calculation.cc
# Opt level: O1

bool __thiscall
sptk::EntropyCalculation::Run
          (EntropyCalculation *this,vector<double,_std::allocator<double>_> *probability,
          double *entropy)

{
  double dVar1;
  EntropyUnits EVar2;
  pointer pdVar3;
  double dVar4;
  long lVar5;
  double dVar6;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (entropy == (double *)0x0) {
    return false;
  }
  pdVar3 = (probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(probability->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar3 >> 3 != (long)this->num_element_) {
    return false;
  }
  EVar2 = this->entropy_unit_;
  if (EVar2 == kBit) {
    if (0 < this->num_element_) {
      dVar6 = 0.0;
      lVar5 = 0;
      do {
        dVar1 = pdVar3[lVar5];
        dVar4 = FloorLog2(dVar1);
        dVar6 = dVar6 + dVar4 * dVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_element_);
      goto LAB_001054da;
    }
  }
  else if (EVar2 == kNat) {
    if (0 < this->num_element_) {
      dVar6 = 0.0;
      lVar5 = 0;
      do {
        dVar1 = pdVar3[lVar5];
        dVar4 = FloorLog(dVar1);
        dVar6 = dVar6 + dVar4 * dVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_element_);
      goto LAB_001054da;
    }
  }
  else {
    if (EVar2 != kDit) {
      return false;
    }
    if (0 < this->num_element_) {
      dVar6 = 0.0;
      lVar5 = 0;
      do {
        dVar1 = pdVar3[lVar5];
        dVar4 = FloorLog10(dVar1);
        dVar6 = dVar6 + dVar4 * dVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_element_);
      goto LAB_001054da;
    }
  }
  dVar6 = 0.0;
LAB_001054da:
  *entropy = -dVar6;
  return true;
}

Assistant:

bool EntropyCalculation::Run(const std::vector<double>& probability,
                             double* entropy) const {
  if (!is_valid_ ||
      probability.size() != static_cast<std::size_t>(num_element_) ||
      NULL == entropy) {
    return false;
  }

  const double* p(&(probability[0]));
  double sum(0.0);

  switch (entropy_unit_) {
    case kBit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog2(p[i]);
      }
      break;
    }
    case kNat: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog(p[i]);
      }
      break;
    }
    case kDit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog10(p[i]);
      }
      break;
    }
    default: {
      return false;
    }
  }

  *entropy = -sum;

  return true;
}